

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest-main.cc
# Opt level: O0

void __thiscall
gflags::anon_unknown_5::
Test_ParseCommandLineFlagsUsesLastDefinitionTest_WhenFlagIsDefinedInCommandLineAndThenFlagFile::
Test_ParseCommandLineFlagsUsesLastDefinitionTest_WhenFlagIsDefinedInCommandLineAndThenFlagFile
          (Test_ParseCommandLineFlagsUsesLastDefinitionTest_WhenFlagIsDefinedInCommandLineAndThenFlagFile
           *this)

{
  value_type local_18;
  Test_ParseCommandLineFlagsUsesLastDefinitionTest_WhenFlagIsDefinedInCommandLineAndThenFlagFile
  *local_10;
  Test_ParseCommandLineFlagsUsesLastDefinitionTest_WhenFlagIsDefinedInCommandLineAndThenFlagFile
  *this_local;
  
  local_18 = Run;
  local_10 = this;
  std::vector<void_(*)(),_std::allocator<void_(*)()>_>::push_back(&g_testlist,&local_18);
  return;
}

Assistant:

TEST(ParseCommandLineFlagsUsesLastDefinitionTest,
     WhenFlagIsDefinedInCommandLineAndThenFlagFile) {
  const char* argv[] = {
    "my_test",
    "--test_flag=0",
    GetFlagFileFlag(),
    NULL,
  };

  EXPECT_EQ(2, ParseTestFlag(true, arraysize(argv) - 1, argv));
  EXPECT_EQ(2, ParseTestFlag(false, arraysize(argv) - 1, argv));
}